

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O2

void __thiscall Inject::configure_context::test_method(configure_context *this)

{
  int iVar1;
  service *psVar2;
  undefined4 extraout_var;
  component<Inject::impl1> xx;
  component<Inject::service> x;
  undefined8 local_100;
  injected<Inject::service> actual;
  undefined **local_e8;
  undefined1 local_e0;
  undefined8 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  unique_id local_b8;
  simple_config s;
  provides<Inject::service> xxx;
  context<0> c;
  char *local_20;
  char *local_18;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&c,"s",(allocator<char> *)&local_e8);
  inject::context<0>::component<Inject::service>::component(&x,(string *)&c);
  std::__cxx11::string::~string((string *)&c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&c,"impl1",(allocator<char> *)&local_e8);
  inject::context<0>::component<Inject::impl1>::component(&xx,(string *)&c);
  std::__cxx11::string::~string((string *)&c);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::provides(&xxx);
  s.super_context_config._vptr_context_config = (context_config)&PTR_bindings_abi_cxx11__0015fac8;
  inject::context<0>::context(&c,&s.super_context_config);
  inject::context<0>::injected<Inject::service>::injected(&actual);
  local_20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_18 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_20,0x11b);
  local_e0 = 0;
  local_e8 = &PTR__lazy_ostream_0015fea8;
  local_d8 = &boost::unit_test::lazy_ostream::inst;
  local_d0 = "";
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_c0 = "";
  psVar2 = inject::context<0>::injected<Inject::service>::operator->(&actual);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  local_100 = CONCAT44(extraout_var,iVar1);
  local_b8 = inject::id_of<Inject::impl1>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_e8,&local_c8,0x11b,1,2,&local_100,"actual->id()",&local_b8,"id_of<impl1>::id()")
  ;
  boost::detail::shared_count::~shared_count(&actual._ptr.pn);
  inject::context<0>::~context(&c);
  inject::context<0>::component<Inject::impl1>::~component(&xx);
  inject::context<0>::component<Inject::service>::~component(&x);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(configure_context)
{
    context<>::component<service> x("s");
    context<>::component<impl1> xx("impl1");
    context<>::component<impl1>::provides<service> xxx;

    class simple_config : public context_config {
    public:
        context_bindings bindings() {
            context_config::context_bindings result;
            result.push_back(config_bind("s", "impl1", scope_none));
            return result;
        }
    };

    simple_config s;
    context<> c(s);

    context<>::injected<service> actual;
    BOOST_CHECK_EQUAL(actual->id(), id_of<impl1>::id());
}